

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

uint nk_check_flags_text(nk_context *ctx,char *text,int len,uint flags,uint value)

{
  int iVar1;
  int old_active;
  uint value_local;
  uint flags_local;
  int len_local;
  char *text_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x504e,
                  "unsigned int nk_check_flags_text(struct nk_context *, const char *, int, unsigned int, unsigned int)"
                 );
  }
  if (text == (char *)0x0) {
    __assert_fail("text",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x504f,
                  "unsigned int nk_check_flags_text(struct nk_context *, const char *, int, unsigned int, unsigned int)"
                 );
  }
  ctx_local._4_4_ = flags;
  if ((ctx != (nk_context *)0x0) && (text != (char *)0x0)) {
    iVar1 = nk_check_text(ctx,text,len,flags & value & value);
    if (iVar1 == 0) {
      old_active = (value ^ 0xffffffff) & flags;
    }
    else {
      old_active = value | flags;
    }
    ctx_local._4_4_ = old_active;
  }
  return ctx_local._4_4_;
}

Assistant:

NK_API unsigned int
nk_check_flags_text(struct nk_context *ctx, const char *text, int len,
    unsigned int flags, unsigned int value)
{
    int old_active;
    NK_ASSERT(ctx);
    NK_ASSERT(text);
    if (!ctx || !text) return flags;
    old_active = (int)((flags & value) & value);
    if (nk_check_text(ctx, text, len, old_active))
        flags |= value;
    else flags &= ~value;
    return flags;
}